

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmLinkItem * __thiscall
cmGeneratorTarget::ResolveLinkItem
          (cmLinkItem *__return_storage_ptr__,cmGeneratorTarget *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *name
          ,cmLocalGenerator *lg,string *linkFeature)

{
  bool bVar1;
  TargetType TVar2;
  ostream *poVar3;
  cmake *this_00;
  string *psVar4;
  string local_308;
  cmListFileBacktrace local_2e8;
  string local_2d8;
  cmListFileBacktrace local_2b8;
  string local_2a8;
  string local_288;
  string local_268;
  undefined1 local_248 [8];
  ostringstream w;
  string local_c8;
  cmListFileBacktrace local_a8;
  string local_98;
  undefined1 local_68 [8];
  TargetOrString resolved;
  cmListFileBacktrace bt;
  string *linkFeature_local;
  cmLocalGenerator *lg_local;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *name_local;
  cmGeneratorTarget *this_local;
  
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&resolved.Target,&name->Backtrace)
  ;
  ResolveTargetReference((TargetOrString *)local_68,this,&name->Value,lg);
  if (resolved.String.field_2._8_8_ == 0) {
    std::__cxx11::string::string((string *)&local_98,(string *)local_68);
    cmListFileBacktrace::cmListFileBacktrace(&local_a8,(cmListFileBacktrace *)&resolved.Target);
    std::__cxx11::string::string((string *)&local_c8,(string *)linkFeature);
    cmLinkItem::cmLinkItem(__return_storage_ptr__,&local_98,false,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_a8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    bVar1 = IsDeprecated((cmGeneratorTarget *)resolved.String.field_2._8_8_);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
      poVar3 = std::operator<<((ostream *)local_248,"The library that is being linked to, ");
      psVar4 = GetName_abi_cxx11_((cmGeneratorTarget *)resolved.String.field_2._8_8_);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,
                               ", is marked as being deprecated by the owner.  The message provided by the developer is: \n"
                              );
      GetDeprecation_abi_cxx11_(&local_268,(cmGeneratorTarget *)resolved.String.field_2._8_8_);
      poVar3 = std::operator<<(poVar3,(string *)&local_268);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_268);
      this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_288,(cmListFileBacktrace *)&resolved.Target)
      ;
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
    }
    TVar2 = GetType((cmGeneratorTarget *)resolved.String.field_2._8_8_);
    if ((TVar2 != EXECUTABLE) ||
       (bVar1 = IsExecutableWithExports((cmGeneratorTarget *)resolved.String.field_2._8_8_), bVar1))
    {
      cmListFileBacktrace::cmListFileBacktrace(&local_2e8,(cmListFileBacktrace *)&resolved.Target);
      std::__cxx11::string::string((string *)&local_308,(string *)linkFeature);
      cmLinkItem::cmLinkItem
                (__return_storage_ptr__,(cmGeneratorTarget *)resolved.String.field_2._8_8_,false,
                 &local_2e8,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      cmListFileBacktrace::~cmListFileBacktrace(&local_2e8);
    }
    else {
      psVar4 = GetName_abi_cxx11_((cmGeneratorTarget *)resolved.String.field_2._8_8_);
      std::__cxx11::string::string((string *)&local_2a8,(string *)psVar4);
      cmListFileBacktrace::cmListFileBacktrace(&local_2b8,(cmListFileBacktrace *)&resolved.Target);
      std::__cxx11::string::string((string *)&local_2d8,(string *)linkFeature);
      cmLinkItem::cmLinkItem(__return_storage_ptr__,&local_2a8,false,&local_2b8,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_2b8);
      std::__cxx11::string::~string((string *)&local_2a8);
    }
  }
  TargetOrString::~TargetOrString((TargetOrString *)local_68);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&resolved.Target);
  return __return_storage_ptr__;
}

Assistant:

cmLinkItem cmGeneratorTarget::ResolveLinkItem(
  BT<std::string> const& name, cmLocalGenerator const* lg,
  std::string const& linkFeature) const
{
  auto bt = name.Backtrace;
  TargetOrString resolved = this->ResolveTargetReference(name.Value, lg);

  if (!resolved.Target) {
    return cmLinkItem(resolved.String, false, bt, linkFeature);
  }

  // Check deprecation, issue message with `bt` backtrace.
  if (resolved.Target->IsDeprecated()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      "The library that is being linked to, "  << resolved.Target->GetName() <<
      ", is marked as being deprecated by the owner.  The message provided by "
      "the developer is: \n" << resolved.Target->GetDeprecation() << "\n";
    /* clang-format on */
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING, w.str(), bt);
  }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (resolved.Target->GetType() == cmStateEnums::EXECUTABLE &&
      !resolved.Target->IsExecutableWithExports()) {
    return cmLinkItem(resolved.Target->GetName(), false, bt, linkFeature);
  }

  return cmLinkItem(resolved.Target, false, bt, linkFeature);
}